

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

word wwShLoCarry(word *a,size_t n,size_t shift,word carry)

{
  byte bVar1;
  ulong uVar2;
  word wVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = n * 0x40 + 0x40;
  uVar6 = shift - uVar2;
  if (shift < uVar2) {
    uVar6 = shift >> 6;
    bVar1 = (byte)shift;
    bVar4 = bVar1 & 0x3f;
    if (shift < 0x40) {
      uVar2 = 0;
    }
    else {
      uVar2 = a[uVar6 - 1] >> bVar4;
    }
    if ((shift & 0x3f) == 0) {
      for (uVar5 = 0; uVar6 + uVar5 < n; uVar5 = uVar5 + 1) {
        a[uVar5] = a[uVar6 + uVar5];
      }
    }
    else {
      wVar3 = carry;
      if (uVar6 < n) {
        wVar3 = a[uVar6];
      }
      for (uVar5 = 0; uVar6 + uVar5 + 1 < n; uVar5 = uVar5 + 1) {
        a[uVar5] = a[uVar6 + uVar5] >> (bVar1 & 0x3f) |
                   a[uVar6 + uVar5 + 1] << 0x40 - (bVar1 & 0x3f);
      }
      uVar2 = wVar3 << (-bVar4 & 0x3f) | uVar2;
      if (uVar6 + uVar5 < n) {
        a[uVar5] = (a + uVar5)[uVar6] >> (bVar1 & 0x3f) | carry << 0x40 - (bVar1 & 0x3f);
        uVar5 = uVar5 + 1;
      }
    }
    if (n <= uVar5) goto LAB_001485b6;
    uVar6 = carry >> bVar4;
    do {
      a[uVar5] = uVar6;
      uVar5 = uVar5 + 1;
LAB_001485b6:
      uVar6 = 0;
    } while (uVar5 < n);
  }
  else {
    wwSetZero(a,n);
    uVar2 = 0;
    if (uVar6 < 0x40) {
      uVar2 = carry >> ((byte)uVar6 & 0x3f);
    }
  }
  return uVar2;
}

Assistant:

word wwShLoCarry(word a[], size_t n, size_t shift, word carry)
{
	register word ret = 0;
	ASSERT(wwIsValid(a, n));
	if (shift < B_PER_W * (n + 1))
	{
		size_t wshift = shift / B_PER_W, pos;
		shift %= B_PER_W;
		// сохраняем вытесняемые разряды
		if (wshift)
			ret = a[wshift - 1] >> shift;
		// величина сдвига не кратна длине слова?
		if (shift)
		{
			// дополнительные вытесняемые разряды
			if (wshift < n)
				ret |= a[wshift] << (B_PER_W - shift);
			else
				ret |= carry << (B_PER_W - shift);
			// сдвиг всех слов, кроме последнего
			for (pos = 0; pos + wshift + 1 < n; pos++)
				a[pos] = a[pos + wshift] >> shift |
					a[pos + wshift + 1] << (B_PER_W - shift);
			// предпоследнее слово
			if (pos + wshift < n)
			{
				a[pos] = a[pos + wshift] >> shift | carry << (B_PER_W - shift);
				++pos;
			}
		}
		// величина сдвига кратна длине слова
		else
		{
			for (pos = 0; pos + wshift < n; pos++)
				a[pos] = a[pos + wshift];
		}
		// последние слова
		if (pos < n)
			a[pos++] = carry >> shift;
		for (; pos < n; a[pos++] = 0);
	}
	else
	{
		wwSetZero(a, n);
		shift -= B_PER_W * (n + 1);
		if (shift < B_PER_W)
			ret = carry >> shift;
	}
	return ret;
}